

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O3

void MULTILABEL::parse_label(parser *p,shared_data *param_2,void *v,v_array<substring> *words)

{
  char *__s;
  int iVar1;
  undefined8 in_RAX;
  substring *psVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  uint32_t n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  v_array<unsigned_int>::clear((v_array<unsigned_int> *)v);
  lVar4 = (long)words->_end - (long)words->_begin >> 4;
  if (lVar4 != 0) {
    if (lVar4 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"example with an odd label, what is ",0x23);
      psVar2 = words->_begin;
      if (words->_end != psVar2) {
        lVar4 = 0;
        uVar5 = 0;
        do {
          __s = *(char **)((long)&psVar2->begin + lVar4);
          if (__s == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2d6a38);
          }
          else {
            sVar3 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
          uVar5 = uVar5 + 1;
          psVar2 = words->_begin;
          lVar4 = lVar4 + 0x10;
        } while (uVar5 < (ulong)((long)words->_end - (long)psVar2 >> 4));
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
      std::ostream::put('8');
      std::ostream::flush();
      return;
    }
    tokenize<v_array<substring>>(',',*words->_begin,&p->parse_name,false);
    psVar2 = (p->parse_name)._begin;
    if ((p->parse_name)._end != psVar2) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        **(undefined1 **)((long)&psVar2->end + lVar4) = 0;
        iVar1 = atoi(*(char **)((long)&((p->parse_name)._begin)->begin + lVar4));
        uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
        v_array<unsigned_int>::push_back((v_array<unsigned_int> *)v,(uint *)((long)&uStack_38 + 4));
        uVar5 = uVar5 + 1;
        psVar2 = (p->parse_name)._begin;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < (ulong)((long)(p->parse_name)._end - (long)psVar2 >> 4));
    }
  }
  return;
}

Assistant:

void parse_label(parser* p, shared_data*, void* v, v_array<substring>& words)
{
  labels* ld = (labels*)v;

  ld->label_v.clear();
  switch (words.size())
  {
    case 0:
      break;
    case 1:
      tokenize(',', words[0], p->parse_name);

      for (size_t i = 0; i < p->parse_name.size(); i++)
      {
        *(p->parse_name[i].end) = '\0';
        uint32_t n = atoi(p->parse_name[i].begin);
        ld->label_v.push_back(n);
      }
      break;
    default:
      cerr << "example with an odd label, what is ";
      for (size_t i = 0; i < words.size(); i++) cerr << words[i].begin << " ";
      cerr << endl;
  }
}